

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int get8_packet_raw(vorb *f)

{
  code *pcVar1;
  byte bVar2;
  int iVar3;
  long in_RDI;
  SDL_AssertState sdl_assert_state;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  if (*(char *)(in_RDI + 0x6e4) == '\0') {
    if (*(int *)(in_RDI + 0x6ec) != 0) {
      return -1;
    }
    iVar3 = next_segment((vorb *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar3 == 0) {
      return -1;
    }
  }
  do {
    if (*(char *)(in_RDI + 0x6e4) != '\0') goto LAB_0013e328;
    in_stack_ffffffffffffffec =
         SDL_ReportAssertion(&get8_packet_raw::sdl_assert_data,"get8_packet_raw",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/stb_vorbis.h"
                             ,0x61b);
  } while (in_stack_ffffffffffffffec == 0);
  if (in_stack_ffffffffffffffec == 1) {
    pcVar1 = (code *)swi(3);
    iVar3 = (*pcVar1)();
    return iVar3;
  }
LAB_0013e328:
  *(char *)(in_RDI + 0x6e4) = *(char *)(in_RDI + 0x6e4) + -1;
  *(int *)(in_RDI + 0x6fc) = *(int *)(in_RDI + 0x6fc) + 1;
  bVar2 = get8((vorb *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return (uint)bVar2;
}

Assistant:

static int get8_packet_raw(vorb *f)
{
   if (!f->bytes_in_seg) {  // CLANG!
      if (f->last_seg) return EOP;
      else if (!next_segment(f)) return EOP;
   }
   assert(f->bytes_in_seg > 0);
   --f->bytes_in_seg;
   ++f->packet_bytes;
   return get8(f);
}